

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void PPC_printInst(MCInst *MI,SStream *O,void *Info)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  byte bVar4;
  char cVar5;
  cs_detail *pcVar6;
  bool bVar7;
  bool bVar8;
  _Bool _Var9;
  uint uVar10;
  uint uVar11;
  arm64_cc aVar12;
  MCOperand *pMVar13;
  ulong uVar14;
  ulong uVar15;
  int64_t iVar16;
  int64_t iVar17;
  MCRegisterClass *pMVar18;
  char *s;
  size_t sVar19;
  long lVar20;
  uint *Modifier;
  SStream *O_00;
  SStream *O_01;
  uint OpNo;
  int v;
  char *pcVar21;
  ppc_alias alias;
  
  uVar10 = MCInst_getOpcode(MI);
  if (uVar10 == 0x311) {
    pMVar13 = MCInst_getOperand(MI,2);
    uVar14 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,3);
    uVar15 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,4);
    iVar16 = MCOperand_getImm(pMVar13);
    uVar10 = (uint)uVar14 & 0xff;
    if ((uVar15 & 0xff) == 0 && uVar10 < 0x20) {
      if (((uint)iVar16 & 0xff) != 0x1f - uVar10) goto LAB_0018cc70;
      SStream_concat0(O,"slwi\t");
      MCInst_setOpcodePub(MI,0x301);
      bVar8 = true;
    }
    else {
      if (0x1f < uVar10) goto LAB_0018cd4a;
LAB_0018cc70:
      bVar8 = false;
    }
    if ((char)iVar16 == '\x1f' && ((uint)uVar15 & 0xff) == 0x20 - uVar10) {
      SStream_concat0(O,"srwi\t");
      MCInst_setOpcodePub(MI,0x302);
      uVar14 = uVar15;
LAB_0018ccb6:
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      pcVar21 = ", %u";
      if (9 < (byte)uVar14) {
        pcVar21 = ", 0x%x";
      }
      SStream_concat(O,pcVar21,uVar14 & 0xff);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar6 = MI->flat_insn->detail;
      bVar4 = (pcVar6->field_6).x86.addr_size;
      lVar20 = (ulong)bVar4 * 0x10;
      puVar3 = pcVar6->groups + lVar20 + 0x1a;
      puVar3[0] = '\x02';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      *(int *)(pcVar6->groups + lVar20 + 0x1e) = (int)(uVar14 & 0xff);
      (pcVar6->field_6).x86.addr_size = bVar4 + 1;
      return;
    }
    if (bVar8) goto LAB_0018ccb6;
  }
LAB_0018cd4a:
  uVar10 = MCInst_getOpcode(MI);
  if ((uVar10 == 0x2e8) || (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x2e9)) {
    pMVar13 = MCInst_getOperand(MI,1);
    uVar10 = MCOperand_getReg(pMVar13);
    pMVar13 = MCInst_getOperand(MI,2);
    uVar11 = MCOperand_getReg(pMVar13);
    if (uVar10 == uVar11) {
      SStream_concat0(O,"mr\t");
      MCInst_setOpcodePub(MI,0x34c);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      return;
    }
  }
  uVar10 = MCInst_getOpcode(MI);
  if (uVar10 == 0x308) {
    pMVar13 = MCInst_getOperand(MI,2);
    iVar16 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,3);
    iVar17 = MCOperand_getImm(pMVar13);
    uVar10 = (uint)iVar16 & 0xff;
    if (0x3f - uVar10 == ((uint)iVar17 & 0xff)) {
      SStream_concat0(O,"sldi\t");
      MCInst_setOpcodePub(MI,0x303);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      if (uVar10 < 10) {
        pcVar21 = ", %u";
      }
      else {
        pcVar21 = ", 0x%x";
      }
      SStream_concat(O,pcVar21,(ulong)uVar10);
      return;
    }
  }
  uVar10 = MCInst_getOpcode(MI);
  if ((((uVar10 == 0x4ed) || (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x4ee)) ||
      (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x4f1)) ||
     (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x4f2)) {
    pMVar13 = MCInst_getOperand(MI,2);
    iVar16 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,2);
    MCOperand_setImm(pMVar13,(iVar16 << 0x32) >> 0x32);
  }
  uVar10 = MCInst_getOpcode(MI);
  if (0xffffffd7 < uVar10 - 0xba) {
    pMVar13 = MCInst_getOperand(MI,0);
    _Var9 = MCOperand_isImm(pMVar13);
    if (_Var9) {
      pMVar13 = MCInst_getOperand(MI,0);
      iVar16 = MCOperand_getImm(pMVar13);
      pMVar13 = MCInst_getOperand(MI,0);
      MCOperand_setImm(pMVar13,(iVar16 << 0x32) >> 0x32);
    }
  }
  uVar10 = MCInst_getOpcode(MI);
  if (((uVar10 == 0x71) || (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x72)) ||
     ((uVar10 = MCInst_getOpcode(MI), uVar10 == 0xba ||
      (uVar10 = MCInst_getOpcode(MI), uVar10 == 0xc0)))) {
    pMVar13 = MCInst_getOperand(MI,0);
    iVar16 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,0);
    MCOperand_setImm(pMVar13,(iVar16 << 0x28) >> 0x28);
  }
  SStream_Init((SStream *)&alias);
  uVar10 = MCInst_getOpcode(MI);
  if (uVar10 - 0x4ed < 8) {
    pcVar21 = (&PTR_anon_var_dwarf_b0494_00298000)[uVar10 - 0x4ed];
    uVar10 = MCInst_getNumOperands(MI);
    bVar8 = false;
    if (uVar10 == 3) {
      bVar8 = false;
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        bVar8 = false;
        pMVar13 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar13);
        if (-1 < iVar16) {
          bVar8 = false;
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 < 2) {
            SStream_concat((SStream *)&alias,pcVar21,"dnzf");
            bVar8 = true;
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar13);
        if (1 < iVar16) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 < 4) {
            SStream_concat((SStream *)&alias,pcVar21,"dzf");
            bVar8 = true;
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar13);
        if (3 < iVar16) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 < 8) {
            pMVar13 = MCInst_getOperand(MI,1);
            _Var9 = MCOperand_isReg(pMVar13);
            if (_Var9) {
              pMVar18 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
              pMVar13 = MCInst_getOperand(MI,1);
              uVar10 = MCOperand_getReg(pMVar13);
              _Var9 = MCRegisterClass_contains(pMVar18,uVar10);
              if (_Var9) {
                pMVar13 = MCInst_getOperand(MI,1);
                uVar10 = MCOperand_getReg(pMVar13);
                uVar10 = (int)(uVar10 - 0xf7) >> 3;
                if (uVar10 < 4) {
                  SStream_concat((SStream *)&alias,pcVar21,
                                 &DAT_001e6508 + *(int *)(&DAT_001e6508 + (ulong)uVar10 * 4));
                }
                bVar8 = false;
                pMVar13 = MCInst_getOperand(MI,0);
                iVar16 = MCOperand_getImm(pMVar13);
                if (iVar16 == 6) {
                  SStream_concat0((SStream *)&alias,"-");
                }
                pMVar13 = MCInst_getOperand(MI,0);
                iVar16 = MCOperand_getImm(pMVar13);
                if (iVar16 == 7) {
                  SStream_concat0((SStream *)&alias,"+");
                }
              }
            }
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar13);
        if (7 < iVar16) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 < 10) {
            SStream_concat((SStream *)&alias,pcVar21,"dnzt");
            bVar8 = true;
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar13);
        if (9 < iVar16) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 < 0xc) {
            bVar8 = true;
            SStream_concat((SStream *)&alias,pcVar21,"dzt");
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar13);
        if (0xb < iVar16) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 < 0x10) {
            pMVar13 = MCInst_getOperand(MI,1);
            _Var9 = MCOperand_isReg(pMVar13);
            if (_Var9) {
              pMVar18 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
              pMVar13 = MCInst_getOperand(MI,1);
              uVar10 = MCOperand_getReg(pMVar13);
              _Var9 = MCRegisterClass_contains(pMVar18,uVar10);
              if (_Var9) {
                pMVar13 = MCInst_getOperand(MI,1);
                uVar10 = MCOperand_getReg(pMVar13);
                uVar10 = (int)(uVar10 - 0xf7) >> 3;
                if (uVar10 < 4) {
                  SStream_concat((SStream *)&alias,pcVar21,
                                 &DAT_001e6518 + *(int *)(&DAT_001e6518 + (ulong)uVar10 * 4));
                }
                bVar8 = false;
                pMVar13 = MCInst_getOperand(MI,0);
                iVar16 = MCOperand_getImm(pMVar13);
                if (iVar16 == 0xe) {
                  SStream_concat0((SStream *)&alias,"-");
                }
                pMVar13 = MCInst_getOperand(MI,0);
                iVar16 = MCOperand_getImm(pMVar13);
                if (iVar16 == 0xf) {
                  SStream_concat0((SStream *)&alias,"+");
                }
              }
            }
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar13);
        if (((uint)iVar16 & 0x12) == 0x10) {
          SStream_concat((SStream *)&alias,pcVar21,"dnz");
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 == 0x18) {
            SStream_concat0((SStream *)&alias,"-");
          }
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 == 0x19) {
            SStream_concat0((SStream *)&alias,"+");
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar13);
        if ((~(uint)iVar16 & 0x12) == 0) {
          SStream_concat((SStream *)&alias,pcVar21,"dz");
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 == 0x1a) {
            SStream_concat0((SStream *)&alias,"-");
          }
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 == 0x1b) {
            SStream_concat0((SStream *)&alias,"+");
          }
        }
      }
    }
    pMVar13 = MCInst_getOperand(MI,1);
    _Var9 = MCOperand_isReg(pMVar13);
    bVar7 = true;
    if (_Var9) {
      pMVar18 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
      pMVar13 = MCInst_getOperand(MI,1);
      uVar10 = MCOperand_getReg(pMVar13);
      _Var9 = MCRegisterClass_contains(pMVar18,uVar10);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        _Var9 = MCOperand_isImm(pMVar13);
        if (_Var9) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar13);
          if (iVar16 < 0x10) {
            pMVar13 = MCInst_getOperand(MI,1);
            uVar10 = MCOperand_getReg(pMVar13);
            uVar10 = uVar10 + 1 & 7;
            if (bVar8) {
              SStream_concat0((SStream *)&alias," ");
              if (uVar10 != 0) {
                SStream_concat((SStream *)&alias,"4*cr%d+",(ulong)uVar10);
              }
              pMVar13 = MCInst_getOperand(MI,1);
              uVar10 = MCOperand_getReg(pMVar13);
              switch((int)(uVar10 - 0xf7) >> 3) {
              case 0:
                SStream_concat0((SStream *)&alias,"eq");
                if (MI->csh->detail != CS_OPT_OFF) {
                  aVar12 = 0x4c;
LAB_0018d7ef:
                  (MI->flat_insn->detail->field_6).arm64.cc = aVar12;
                }
                break;
              case 1:
                SStream_concat0((SStream *)&alias,"gt");
                if (MI->csh->detail != CS_OPT_OFF) {
                  aVar12 = 0x2c;
                  goto LAB_0018d7ef;
                }
                break;
              case 2:
                SStream_concat0((SStream *)&alias,"lt");
                if (MI->csh->detail != CS_OPT_OFF) {
                  aVar12 = ARM64_CC_LT;
                  goto LAB_0018d7ef;
                }
                break;
              case 3:
                SStream_concat0((SStream *)&alias,"so");
                aVar12 = 0x8c;
                if (MI->csh->detail != CS_OPT_OFF) goto LAB_0018d7ef;
              }
              pMVar13 = MCInst_getOperand(MI,1);
              uVar10 = MCOperand_getReg(pMVar13);
              uVar10 = uVar10 + 1 & 7;
              if ((uVar10 != 0) && (MI->csh->detail != CS_OPT_OFF)) {
                pcVar6 = MI->flat_insn->detail;
                puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x1a;
                puVar3[0] = '@';
                puVar3[1] = '\0';
                puVar3[2] = '\0';
                puVar3[3] = '\0';
                pcVar6 = MI->flat_insn->detail;
                puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x1e;
                puVar3[0] = '\x04';
                puVar3[1] = '\0';
                puVar3[2] = '\0';
                puVar3[3] = '\0';
                pcVar6 = MI->flat_insn->detail;
                *(uint *)(pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x22) =
                     uVar10 + 3;
                pcVar6 = MI->flat_insn->detail;
                *(undefined4 *)
                 (pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x26) =
                     *(undefined4 *)(pcVar6->field_6).x86.prefix;
LAB_0018d8ab:
                puVar3 = &(MI->flat_insn->detail->field_6).x86.addr_size;
                *puVar3 = *puVar3 + '\x01';
              }
              bVar7 = false;
            }
            else if (uVar10 != 0) {
              bVar7 = false;
              SStream_concat((SStream *)&alias," cr%d",(ulong)uVar10);
              if (MI->csh->detail != CS_OPT_OFF) {
                pcVar6 = MI->flat_insn->detail;
                puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x1a;
                puVar3[0] = '\x01';
                puVar3[1] = '\0';
                puVar3[2] = '\0';
                puVar3[3] = '\0';
                pcVar6 = MI->flat_insn->detail;
                *(uint *)(pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x1e) =
                     uVar10 + 3;
                goto LAB_0018d8ab;
              }
            }
          }
        }
      }
    }
    pMVar13 = MCInst_getOperand(MI,2);
    _Var9 = MCOperand_isImm(pMVar13);
    if (_Var9) {
      pMVar13 = MCInst_getOperand(MI,2);
      iVar16 = MCOperand_getImm(pMVar13);
      if (iVar16 != 0) {
        if (!bVar7) {
          SStream_concat0((SStream *)&alias,",");
        }
        SStream_concat0((SStream *)&alias,anon_var_dwarf_b087b + 4);
      }
    }
    s = cs_strdup((char *)&alias);
    for (pcVar21 = s; cVar5 = *pcVar21, cVar5 != '\0'; pcVar21 = pcVar21 + 1) {
      if ((cVar5 == ' ') || (cVar5 == '\t')) {
        *pcVar21 = '\0';
        pcVar21 = pcVar21 + 1;
        break;
      }
    }
    SStream_concat0(O,s);
    if (*pcVar21 != '\0') {
      SStream_concat0(O,anon_var_dwarf_70948 + 0x11);
      do {
        cVar5 = *pcVar21;
        if (cVar5 == '$') {
          pcVar1 = pcVar21 + 1;
          if (*pcVar1 == -1) {
            pcVar1 = pcVar21 + 2;
            pcVar2 = pcVar21 + 3;
            pcVar21 = pcVar21 + 3;
            printCustomAliasOperand(MI,(int)*pcVar1 - 1,(int)*pcVar2 - 1,O);
          }
          else {
            pcVar21 = pcVar21 + 1;
            printOperand(MI,(int)*pcVar1 - 1,O);
          }
        }
        else {
          if (cVar5 == '\0') break;
          SStream_concat(O,"%c",(ulong)(uint)(int)cVar5);
        }
        pcVar21 = pcVar21 + 1;
      } while( true );
    }
    if (s != (char *)0x0) goto LAB_0018d9e1;
  }
  s = printAliasInstr(MI,O,Info);
  if (s != (char *)0x0) {
LAB_0018d9e1:
    sVar19 = strlen(s);
    if (((ulong)(byte)s[sVar19 - 1] < 0x2f) &&
       ((0x680000000000U >> ((ulong)(byte)s[sVar19 - 1] & 0x3f) & 1) != 0)) {
      s[sVar19 - 1] = '\0';
    }
    _Var9 = PPC_alias_insn(s,&alias);
    if ((_Var9) && (MCInst_setOpcodePub(MI,alias.id), MI->csh->detail != CS_OPT_OFF)) {
      (MI->flat_insn->detail->field_6).arm64.cc = alias.cc;
    }
    (*cs_mem_free)(s);
    return;
  }
  uVar10 = MCInst_getOpcode(MI);
  uVar10 = *(uint *)(printInstruction_OpInfo + (ulong)uVar10 * 4);
  uVar11 = MCInst_getOpcode(MI);
  bVar4 = printInstruction_OpInfo2[uVar11];
  SStream_concat0(O,(char *)((ulong)(uVar10 & 0x3fff) + 0x324a4f));
  uVar11 = (uint)O;
  switch(uVar10 >> 0xe & 0xf) {
  case 1:
    OpNo = 0;
    goto LAB_0018dbe8;
  case 2:
    printU16ImmOperand(MI,0,O);
    break;
  case 3:
    printBranchOperand(MI,0,O);
    break;
  case 4:
    printAbsBranchOperand(MI,0,O);
    break;
  case 5:
    printPredicateOperand
              (MI,uVar11,(SStream *)0x24764d,(char *)&switchD_0018dad4::switchdataD_001e4420);
    break;
  case 6:
    set_mem_access(MI,true);
    SStream_concat0(O,"(");
    printOperand(MI,1,O);
    SStream_concat0(O,")");
    set_mem_access(MI,false);
    break;
  case 7:
    uVar10 = 0;
    goto LAB_0018dbb1;
  case 8:
    printU5ImmOperand(MI,0,O);
    break;
  case 9:
    OpNo = 1;
LAB_0018dbe8:
    printOperand(MI,OpNo,O);
    break;
  case 10:
    uVar10 = 0;
    goto LAB_0018db13;
  case 0xb:
    printcrbitm(MI,0,O);
    goto LAB_0018dbcb;
  case 0xc:
    printU4ImmOperand(MI,uVar11,O_00);
    pcVar21 = ", ";
    goto LAB_0018dc29;
  default:
    goto switchD_0018dad4_default;
  }
  Modifier = &switchD_0018dc14::switchdataD_001e4450;
  switch(uVar10 >> 0x12 & 0x1f) {
  case 1:
  case 0xc:
    goto switchD_0018dad4_default;
  case 2:
    pcVar21 = " ";
    goto LAB_0018ddda;
  case 4:
    pcVar21 = ",a";
    goto LAB_0018dca1;
  case 5:
    pcVar21 = "ctr";
    break;
  case 6:
    pcVar21 = "ctrl";
    break;
  case 7:
    SStream_concat0(O,"l");
  case 3:
    printPredicateOperand(MI,uVar11,(SStream *)0x24dfdd,(char *)Modifier);
    SStream_concat0(O," ");
    printPredicateOperand(MI,uVar11,(SStream *)0x1e3bc6,(char *)Modifier);
    SStream_concat0(O,", ");
    uVar10 = 2;
    goto LAB_0018ddc9;
  case 8:
    pcVar21 = "bla";
LAB_0018dca1:
    SStream_concat0(O,pcVar21 + 1);
    printPredicateOperand(MI,uVar11,(SStream *)0x24dfdd,(char *)Modifier);
    SStream_concat0(O," ");
    printPredicateOperand(MI,uVar11,(SStream *)0x1e3bc6,(char *)Modifier);
    SStream_concat0(O,", ");
    goto LAB_0018dcf4;
  case 9:
    pcVar21 = "lr";
    break;
  case 10:
    pcVar21 = "lrl";
    break;
  case 0xb:
    goto switchD_0018dc14_caseD_b;
  case 0xd:
    SStream_concat0(O,", 268");
    v = 0x10c;
    goto LAB_0018dd15;
  case 0xe:
    SStream_concat0(O,", 256");
    v = 0x100;
    goto LAB_0018dd15;
  case 0xf:
    pcVar21 = ",";
LAB_0018dc29:
    SStream_concat0(O,pcVar21);
    uVar10 = 0;
    goto LAB_0018dc39;
  case 0x10:
    SStream_concat0(O,", -1");
    v = -1;
LAB_0018dd15:
    op_addImm(MI,v);
    return;
  default:
    pcVar21 = ", ";
LAB_0018ddda:
    SStream_concat0(O,pcVar21);
    switch(uVar10 >> 0x17 & 0xf) {
    case 0:
      uVar11 = 1;
      goto LAB_0018de23;
    case 1:
      uVar10 = 1;
      goto LAB_0018dedb;
    case 2:
      printMemRegReg(MI,1,O);
      goto LAB_0018df02;
    case 3:
      uVar10 = 1;
      goto LAB_0018ddc9;
    case 4:
      uVar11 = 0;
LAB_0018de23:
      printOperand(MI,uVar11,O);
      goto LAB_0018df02;
    case 5:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
LAB_0018df02:
      switch(uVar10 >> 0x1b & 0xf) {
      case 1:
        goto switchD_0018dad4_default;
      case 2:
        SStream_concat0(O," ");
        printOperand(MI,3,O);
        SStream_concat0(O," ");
        uVar10 = 4;
        goto LAB_0018dc39;
      case 3:
        uVar10 = 0;
        break;
      case 4:
        printU6ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        uVar10 = 4;
        goto LAB_0018e02d;
      case 5:
        printU5ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        printU5ImmOperand(MI,4,O);
        SStream_concat0(O,", ");
        uVar10 = 5;
        break;
      case 6:
        uVar10 = 1;
        break;
      case 7:
switchD_0018dc14_caseD_b:
        pcVar21 = ", 0";
LAB_0018df61:
        SStream_concat0(O,pcVar21);
        return;
      case 8:
        uVar10 = 3;
        goto LAB_0018dc39;
      default:
        SStream_concat0(O,", ");
        switch((uint)(CONCAT14(bVar4,uVar10) >> 0x1f) & 0xf) {
        case 1:
          uVar10 = 2;
LAB_0018de39:
          printS16ImmOperand(MI,uVar10,O);
          break;
        case 2:
          uVar10 = 2;
LAB_0018dedb:
          printU16ImmOperand(MI,uVar10,O);
          break;
        case 3:
          printU6ImmOperand(MI,2,O);
          goto LAB_0018e19f;
        case 4:
          printU5ImmOperand(MI,2,O);
          goto LAB_0018e19f;
        case 5:
          uVar10 = 0;
          goto LAB_0018dc39;
        case 6:
          uVar10 = 2;
          goto LAB_0018e1f2;
        case 7:
          uVar10 = 2;
LAB_0018ddc9:
          printBranchOperand(MI,uVar10,O);
          break;
        case 8:
LAB_0018dcf4:
          printAbsBranchOperand(MI,2,O);
          break;
        default:
          printOperand(MI,2,O);
LAB_0018e19f:
          if ((bVar4 & 8) == 0) {
            return;
          }
          SStream_concat0(O,", ");
          switch(bVar4 >> 4 & 3) {
          case 0:
            uVar10 = 3;
LAB_0018e02d:
            printU6ImmOperand(MI,uVar10,O);
            break;
          case 1:
            printU5ImmOperand(MI,3,O);
            if ((bVar4 & 0x40) == 0) {
              return;
            }
            SStream_concat0(O,", ");
            uVar10 = 4;
            goto LAB_0018e044;
          case 2:
            uVar10 = 3;
LAB_0018dc39:
            printOperand(MI,uVar10,O);
            break;
          case 3:
            uVar10 = 3;
LAB_0018e1f2:
            printU2ImmOperand(MI,uVar10,O);
          }
        }
        goto switchD_0018dad4_default;
      }
LAB_0018e044:
      printU5ImmOperand(MI,uVar10,O);
      break;
    case 6:
      printU5ImmOperand(MI,2,O);
LAB_0018dbcb:
      SStream_concat0(O,", ");
      uVar10 = 1;
      goto LAB_0018dc39;
    case 7:
      uVar10 = 1;
      goto LAB_0018db13;
    case 8:
      printU5ImmOperand(MI,1,O);
      SStream_concat0(O,", ");
      uVar10 = 2;
      goto LAB_0018dc39;
    case 9:
      printS16ImmOperand(MI,2,O);
      SStream_concat0(O,"(");
      printOperand(MI,1,O);
      pcVar21 = ")";
      goto LAB_0018df61;
    case 10:
      uVar10 = 2;
LAB_0018db13:
      printMemRegImm(MI,uVar10,O);
      break;
    case 0xb:
      uVar10 = 2;
LAB_0018dbb1:
      printMemRegReg(MI,uVar10,O);
      break;
    case 0xc:
      uVar10 = 1;
      goto LAB_0018de39;
    case 0xd:
      printcrbitm(MI,1,O);
      break;
    case 0xe:
      printU4ImmOperand(MI,uVar11,O_01);
      break;
    case 0xf:
      pMVar13 = MCInst_getOperand(MI,1);
      iVar16 = MCOperand_getImm(pMVar13);
      uVar10 = ((int)iVar16 << 0x1b) >> 0x1b;
      if ((int)uVar10 < 0) {
        uVar11 = -uVar10;
        if (uVar10 < 0xfffffff7) {
          pcVar21 = "-0x%x";
        }
        else {
          pcVar21 = "-%u";
        }
      }
      else {
        uVar11 = uVar10;
        if (uVar10 < 10) {
          pcVar21 = "%u";
        }
        else {
          pcVar21 = "0x%x";
        }
      }
      SStream_concat(O,pcVar21,(ulong)uVar11);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar6 = MI->flat_insn->detail;
        puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x1a;
        puVar3[0] = '\x02';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar6 = MI->flat_insn->detail;
        *(uint *)(pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x1e) = uVar10;
        puVar3 = &(MI->flat_insn->detail->field_6).x86.addr_size;
        *puVar3 = *puVar3 + '\x01';
      }
    }
    goto switchD_0018dad4_default;
  }
  SStream_concat0(O,pcVar21);
  printPredicateOperand(MI,uVar11,(SStream *)0x24dfdd,(char *)Modifier);
  SStream_concat0(O," ");
  printPredicateOperand(MI,uVar11,(SStream *)0x1e3bc6,(char *)Modifier);
switchD_0018dad4_default:
  return;
}

Assistant:

void PPC_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;

	// Check for slwi/srwi mnemonics.
	if (MCInst_getOpcode(MI) == PPC_RLWINM) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char MB = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 4));
		bool useSubstituteMnemonic = false;

		if (SH <= 31 && MB == 0 && ME == (31-SH)) {
			SStream_concat0(O, "slwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLWI);
			useSubstituteMnemonic = true;
		}

		if (SH <= 31 && MB == (32-SH) && ME == 31) {
			SStream_concat0(O, "srwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SRWI);
			useSubstituteMnemonic = true;
			SH = 32-SH;
		}

		if (useSubstituteMnemonic) {
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			if (MI->csh->detail) {
				cs_ppc *ppc = &MI->flat_insn->detail->ppc;

				ppc->operands[ppc->op_count].type = PPC_OP_IMM;
				ppc->operands[ppc->op_count].imm = SH;
				++ppc->op_count;
			}

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_OR || MCInst_getOpcode(MI) == PPC_OR8) &&
			MCOperand_getReg(MCInst_getOperand(MI, 1)) == MCOperand_getReg(MCInst_getOperand(MI, 2))) {
		SStream_concat0(O, "mr\t");
		MCInst_setOpcodePub(MI, PPC_INS_MR);
		printOperand(MI, 0, O);
		SStream_concat0(O, ", ");
		printOperand(MI, 1, O);
		return;
	}

	if (MCInst_getOpcode(MI) == PPC_RLDICR) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		// rldicr RA, RS, SH, 63-SH == sldi RA, RS, SH
		if (63-SH == ME) {
			SStream_concat0(O, "sldi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLDI);
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_gBC)||(MCInst_getOpcode(MI) == PPC_gBCA)||
			(MCInst_getOpcode(MI) == PPC_gBCL)||(MCInst_getOpcode(MI) == PPC_gBCLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 2));
		bd = SignExtend64(bd, 14);
		MCOperand_setImm(MCInst_getOperand(MI, 2),bd);
	}

	if (isBOCTRBranch(MCInst_getOpcode(MI))) {
		if (MCOperand_isImm(MCInst_getOperand(MI,0)))
		{
			int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
			bd = SignExtend64(bd, 14);
			MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_B)||(MCInst_getOpcode(MI) == PPC_BA)||
			(MCInst_getOpcode(MI) == PPC_BL)||(MCInst_getOpcode(MI) == PPC_BLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
		bd = SignExtend64(bd, 24);
		MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
	}

	// consider our own alias instructions first
	mnem = printAliasInstrEx(MI, O, Info);
	if (!mnem)
		mnem = printAliasInstr(MI, O, Info);

	if (mnem) {
		struct ppc_alias alias;
		// check to remove the last letter of ('.', '-', '+')
		if (mnem[strlen(mnem) - 1] == '-' || mnem[strlen(mnem) - 1] == '+' || mnem[strlen(mnem) - 1] == '.')
			mnem[strlen(mnem) - 1] = '\0';

		if (PPC_alias_insn(mnem, &alias)) {
			MCInst_setOpcodePub(MI, alias.id);
			if (MI->csh->detail) {
				MI->flat_insn->detail->ppc.bc = (ppc_bc)alias.cc;
			}
		}

		cs_mem_free(mnem);
	} else
		printInstruction(MI, O, NULL);
}